

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_viewport.cpp
# Opt level: O3

bool __thiscall ON_Viewport::ZoomToScreenRect(ON_Viewport *this,int x0,int y0,int x1,int y1)

{
  double dVar1;
  double dVar2;
  double dVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  bool bVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  ON_3dVector dolly_vector;
  ON_3dVector local_48;
  
  if (this->m_bValidPort != true) {
    return false;
  }
  iVar4 = this->m_port_left;
  iVar5 = this->m_port_right;
  iVar6 = this->m_port_bottom;
  iVar7 = this->m_port_top;
  iVar13 = (x1 + x0) / 2;
  iVar11 = (y1 + y0) / 2;
  iVar12 = (iVar5 + iVar4) / 2;
  iVar10 = (iVar7 + iVar6) / 2;
  bVar8 = GetDollyCameraVector
                    (this,iVar13,iVar11,iVar12,iVar10,(this->m_frus_near + this->m_frus_far) * 0.5,
                     &local_48);
  if (((bVar8) && (bVar8 = DollyCamera(this,&local_48), bVar8)) && (this->m_bValidFrustum == true))
  {
    iVar10 = iVar10 - iVar11;
    iVar9 = y1 + iVar10;
    iVar10 = iVar10 + y0;
    iVar12 = iVar12 - iVar13;
    iVar13 = iVar12 + x1;
    iVar12 = iVar12 + x0;
    iVar11 = iVar12;
    if (x1 < x0) {
      iVar11 = iVar13;
      iVar13 = iVar12;
    }
    iVar12 = iVar11;
    if (iVar5 < iVar4) {
      iVar12 = iVar13;
      iVar13 = iVar11;
    }
    iVar11 = iVar10;
    if (y0 <= y1) {
      iVar11 = iVar9;
      iVar9 = iVar10;
    }
    iVar10 = iVar11;
    if (iVar6 <= iVar7) {
      iVar10 = iVar9;
      iVar9 = iVar11;
    }
    dVar18 = (double)(iVar12 - iVar4) / (double)(iVar5 - iVar4);
    dVar20 = (double)(iVar13 - iVar4) / (double)(iVar5 - iVar4);
    dVar16 = 0.0;
    if ((0.001 < ABS(dVar18)) && (dVar16 = dVar18, ABS(dVar18 + -1.0) <= 0.001)) {
      dVar16 = 1.0;
    }
    dVar17 = (double)(iVar10 - iVar6) / (double)(iVar7 - iVar6);
    dVar18 = 0.0;
    if ((0.001 < ABS(dVar20)) && (dVar18 = dVar20, ABS(dVar20 + -1.0) <= 0.001)) {
      dVar18 = 1.0;
    }
    dVar19 = (double)(iVar9 - iVar6) / (double)(iVar7 - iVar6);
    dVar20 = 0.0;
    if ((0.001 < ABS(dVar17)) && (dVar20 = dVar17, ABS(dVar17 + -1.0) <= 0.001)) {
      dVar20 = 1.0;
    }
    dVar17 = 0.0;
    if ((0.001 < ABS(dVar19)) && (dVar17 = dVar19, ABS(dVar19 + -1.0) <= 0.001)) {
      dVar17 = 1.0;
    }
    if ((0.001 < ABS(dVar16 - dVar18)) && (0.001 < ABS(dVar20 - dVar17))) {
      dVar19 = this->m_frus_left;
      dVar1 = this->m_frus_right;
      dVar2 = this->m_frus_bottom;
      dVar3 = this->m_frus_top;
      dVar21 = (1.0 - dVar20) * dVar2 + dVar20 * dVar3;
      dVar22 = (1.0 - dVar16) * dVar19 + dVar16 * dVar1;
      dVar20 = dVar2 * (1.0 - dVar17) + dVar17 * dVar3;
      dVar17 = dVar19 * (1.0 - dVar18) + dVar18 * dVar1;
      auVar14._0_8_ = -dVar21;
      auVar14._8_8_ = -dVar22;
      dVar16 = (double)(~-(ulong)(dVar20 < auVar14._0_8_) & (ulong)-dVar20 |
                       (ulong)dVar21 & -(ulong)(dVar20 < auVar14._0_8_));
      dVar18 = (double)(~-(ulong)(dVar17 < auVar14._8_8_) & (ulong)-dVar17 |
                       (ulong)dVar22 & -(ulong)(dVar17 < auVar14._8_8_));
      auVar15._8_8_ = dVar17;
      auVar15._0_8_ = dVar20;
      auVar15 = maxpd(auVar14,auVar15);
      dVar20 = auVar15._0_8_;
      dVar17 = auVar15._8_8_;
      dVar21 = (dVar1 - dVar19) * (dVar20 - dVar16);
      dVar22 = (dVar3 - dVar2) * (dVar17 - dVar18);
      if (dVar22 <= dVar21) {
        dVar19 = (dVar21 / (dVar3 - dVar2) - (dVar17 - dVar18)) * 0.5;
        dVar18 = dVar18 - dVar19;
        dVar17 = dVar17 + dVar19;
      }
      else {
        dVar19 = (dVar22 / (dVar1 - dVar19) - (dVar20 - dVar16)) * 0.5;
        dVar16 = dVar16 - dVar19;
        dVar20 = dVar19 + dVar20;
      }
      bVar8 = SetFrustum(this,dVar18,dVar17,dVar16,dVar20,this->m_frus_near,this->m_frus_far);
      return bVar8;
    }
  }
  return false;
}

Assistant:

bool ON_Viewport::ZoomToScreenRect( int x0, int y0, int x1, int y1 )
{
  int port_left, port_right, port_bottom, port_top, port_near, port_far;
  if ( !GetScreenPort( &port_left, &port_right, 
                       &port_bottom, &port_top, 
                       &port_near, &port_far ) )
    return false;

  // dolly camera sideways so it's looking at center of rectangle
  int dx = (x0+x1)/2;
  int dy = (y0+y1)/2;
  int cx = (port_left+port_right)/2;
  int cy = (port_bottom+port_top)/2;

  ON_3dVector dolly_vector;
  if ( !GetDollyCameraVector( dx, dy, cx, cy, 0.5*(FrustumNear()+FrustumFar()), dolly_vector ) )
    return false;
  if ( !DollyCamera( dolly_vector ) )
    return false;

  // adjust frustum
  dx = cx - dx;
  dy = cy - dy;
  x0 += dx;
  x1 += dx;
  y0 += dy;
  y1 += dy;
  double frus_left, frus_right, frus_bottom, frus_top, frus_near, frus_far;
  if ( !GetFrustum( &frus_left,   &frus_right, 
                     &frus_bottom, &frus_top, 
                     &frus_near,   &frus_far ) )
    return false;
  double s0,t0,s1,t1;
  if ( !GetRelativeScreenCoordinates(port_left, port_right, port_bottom, port_top,
                              true,
                              x0,y0,x1,y1,
                              s0,t0,s1,t1) )
    return false;
  double w = frus_right - frus_left;
  double h = frus_top - frus_bottom;
  double a0 = (1.0-s0)*frus_left   + s0*frus_right;
  double a1 = (1.0-s1)*frus_left   + s1*frus_right;
  double b0 = (1.0-t0)*frus_bottom + t0*frus_top;
  double b1 = (1.0-t1)*frus_bottom + t1*frus_top;
  if ( -a0 > a1 ) a1 = -a0; else a0 = -a1;
  if ( -b0 > b1 ) b1 = -b0; else b0 = -b1;
  double d;
  if ( (b1-b0)*w < (a1-a0)*h ) {
    d = (a1-a0)*h/w;
    d = 0.5*(d - (b1-b0));
    b0 -= d;
    b1 += d;
  }
  else {
    d = (b1-b0)*w/h;
    d = 0.5*(d - (a1-a0));
    a0 -= d;
    a1 += d;
  }

  return SetFrustum( a0, a1, b0, b1, frus_near, frus_far );
}